

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<char_const*,float>::load_impl_sequence<0ul,1ul>
          (argument_loader<char_const*,float> *this,long call)

{
  handle src;
  bool bVar1;
  
  src.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  if (src.m_ptr != (PyObject *)0x0) {
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if ((**(ulong **)(call + 0x20) & 1) != 0) {
        this[0x28] = (argument_loader<char_const*,float>)0x1;
        goto LAB_00248d35;
      }
    }
    else {
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)(this + 8),src,(bool)((byte)**(ulong **)(call + 0x20) & 1));
      if (bVar1) {
LAB_00248d35:
        bVar1 = type_caster<float,_void>::load
                          ((type_caster<float,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                           SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }